

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::deletetextures(NegativeTestContext *ctx)

{
  allocator<char> local_3d;
  GLuint texture;
  string local_38;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_INVALID_VALUE is generated if n is negative.",&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,-1,(GLuint *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,-1,(GLuint *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void deletetextures (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	ctx.glGenTextures(1, &texture);

	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	ctx.glDeleteTextures(-1, 0);
	ctx.expectError(GL_INVALID_VALUE);

	ctx.glBindTexture(GL_TEXTURE_2D, texture);
	ctx.glDeleteTextures(-1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}